

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_array.hpp
# Opt level: O0

reference __thiscall
pstore::sparse_array<(anonymous_namespace)::ctor_counter,_unsigned_long>::operator[]
          (sparse_array<(anonymous_namespace)::ctor_counter,_unsigned_long> *this,size_type pos)

{
  ctor_counter *pcVar1;
  size_type pos_local;
  sparse_array<(anonymous_namespace)::ctor_counter,_unsigned_long> *this_local;
  
  pcVar1 = sparse_array<(anonymous_namespace)::ctor_counter,unsigned_long>::
           index_impl<pstore::sparse_array<(anonymous_namespace)::ctor_counter,unsigned_long>&,(anonymous_namespace)::ctor_counter>
                     (this,pos);
  return pcVar1;
}

Assistant:

reference operator[] (size_type pos) noexcept {
            return sparse_array::index_impl (*this, pos);
        }